

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randen_engine.h
# Opt level: O2

void __thiscall
absl::lts_20250127::random_internal::randen_engine<unsigned_long>::seed
          (randen_engine<unsigned_long> *this,result_type_conflict seed_value)

{
  char *pcVar1;
  ulong uVar2;
  long lVar3;
  
  this->next_ = 0x20;
  uVar2 = (ulong)((uint)this & 8);
  pcVar1 = this->raw_state_ + uVar2;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  pcVar1[8] = '\0';
  pcVar1[9] = '\0';
  pcVar1[10] = '\0';
  pcVar1[0xb] = '\0';
  pcVar1[0xc] = '\0';
  pcVar1[0xd] = '\0';
  pcVar1[0xe] = '\0';
  pcVar1[0xf] = '\0';
  for (lVar3 = 0x10; lVar3 != 0x100; lVar3 = lVar3 + 8) {
    *(result_type_conflict *)(this->raw_state_ + lVar3 + uVar2) = seed_value;
  }
  return;
}

Assistant:

void seed(result_type seed_value = 0) {
    next_ = kStateSizeT;
    // Zeroes the inner state and fills the outer state with seed_value to
    // mimic the behaviour of reseed
    auto* begin = state();
    std::fill(begin, begin + kCapacityT, 0);
    std::fill(begin + kCapacityT, begin + kStateSizeT, seed_value);
  }